

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdAdaptEcdsaAdaptor(void *handle,char *adaptor_signature,char *adaptor_secret,char **signature)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ByteData sig;
  int result;
  string *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffe20;
  string local_1c0;
  allocator local_199;
  string local_198;
  Privkey local_178;
  allocator local_151;
  string local_150;
  AdaptorSignature local_130;
  ByteData local_118;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined4 local_2c;
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x115;
    local_58.funcname = "CfdAdaptEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_58,"adaptor_signature is null or empty.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"Failed to parameter. adaptor_signature is null or empty.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    if (local_28 == (undefined8 *)0x0) {
      local_d8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                   ,0x2f);
      local_d8.filename = local_d8.filename + 1;
      local_d8.line = 0x121;
      local_d8.funcname = "CfdAdaptEcdsaAdaptor";
      cfd::core::logger::warn<>(&local_d8,"signature is null.");
      local_fa = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"Failed to parameter. signature is null.",&local_f9);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
      local_fa = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,local_18,&local_151);
    cfd::core::AdaptorSignature::AdaptorSignature(&local_130,&local_150);
    paVar4 = &local_199;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,local_20,paVar4);
    cfd::core::Privkey::Privkey(&local_178,&local_198,kMainnet,true);
    cfd::core::AdaptorUtil::Adapt(&local_118,&local_130,&local_178);
    cfd::core::Privkey::~Privkey((Privkey *)0x5cc359);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    cfd::core::AdaptorSignature::~AdaptorSignature((AdaptorSignature *)0x5cc380);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1c0,&local_118);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffe20);
    *local_28 = pcVar3;
    std::__cxx11::string::~string((string *)&local_1c0);
    local_4 = 0;
    cfd::core::ByteData::~ByteData((ByteData *)0x5cc3fa);
    return local_4;
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x11b;
  local_98.funcname = "CfdAdaptEcdsaAdaptor";
  cfd::core::logger::warn<>(&local_98,"adaptor_secret is null or empty.");
  local_ba = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,"Failed to parameter. adaptor_secret is null or empty.",&local_b9);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
  local_ba = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAdaptEcdsaAdaptor(
    void* handle, const char* adaptor_signature, const char* adaptor_secret,
    char** signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(adaptor_secret)) {
      warn(CFD_LOG_SOURCE, "adaptor_secret is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_secret is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    ByteData sig = AdaptorUtil::Adapt(
        AdaptorSignature(adaptor_signature), Privkey(adaptor_secret));

    *signature = CreateString(sig.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}